

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_Expression * __thiscall
ZCCCompiler::ApplyConversion(ZCCCompiler *this,ZCC_Expression *expr,Conversion **route,int routelen)

{
  int local_28;
  int i;
  int routelen_local;
  Conversion **route_local;
  ZCC_Expression *expr_local;
  ZCCCompiler *this_local;
  
  route_local = (Conversion **)expr;
  for (local_28 = 0; local_28 < routelen; local_28 = local_28 + 1) {
    if (*(int *)(route_local + 4) == 4) {
      (*route[local_28]->ConvertConstant)((ZCC_ExprConstant *)route_local,&this->AST->Strings);
    }
    else {
      route_local = (Conversion **)
                    AddCastNode(this,route[local_28]->TargetType,(ZCC_Expression *)route_local);
    }
  }
  return (ZCC_Expression *)route_local;
}

Assistant:

ZCC_Expression *ZCCCompiler::ApplyConversion(ZCC_Expression *expr, const PType::Conversion **route, int routelen)
{
	for (int i = 0; i < routelen; ++i)
	{
		if (expr->Operation != PEX_ConstValue)
		{
			expr = AddCastNode(route[i]->TargetType, expr);
		}
		else
		{
			route[i]->ConvertConstant(static_cast<ZCC_ExprConstant *>(expr), AST.Strings);
		}
	}
	return expr;
}